

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::
     Dispose_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
     destruct(void *ptr)

{
  void *ptr_local;
  
  dtor<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }